

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_iterator_t * roaring64_iterator_create_last(roaring64_bitmap_t *r)

{
  roaring64_iterator_t *prVar1;
  roaring64_iterator_t *it;
  _Bool in_stack_00000077;
  roaring64_iterator_t *in_stack_00000078;
  roaring64_bitmap_t *in_stack_00000080;
  
  roaring_malloc(0x10bae3);
  prVar1 = roaring64_iterator_init_at(in_stack_00000080,in_stack_00000078,in_stack_00000077);
  return prVar1;
}

Assistant:

roaring64_iterator_t *roaring64_iterator_create_last(
    const roaring64_bitmap_t *r) {
    roaring64_iterator_t *it =
        (roaring64_iterator_t *)roaring_malloc(sizeof(roaring64_iterator_t));
    return roaring64_iterator_init_at(r, it, /*first=*/false);
}